

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::append_entries
          (raft_server *this,
          vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
          *logs)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined8 *puVar5;
  ptr<async_result<bool>_> pVar6;
  bool result;
  ptr<req_msg> req;
  value_type local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  if (in_RDX[1] == *in_RDX) {
    local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr & 0xffffffffffffff00);
    std::
    __shared_ptr<cornerstone::async_result<bool,std::shared_ptr<std::exception>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<std::allocator<cornerstone::async_result<bool,std::shared_ptr<std::exception>>>,bool&>
              ((__shared_ptr<cornerstone::async_result<bool,std::shared_ptr<std::exception>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(allocator<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>_>
                        *)&local_48,(bool *)&local_58);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    local_38 = logs;
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    local_40->_M_use_count = 1;
    local_40->_M_weak_count = 1;
    local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176788;
    local_48 = local_40 + 1;
    local_40[1]._M_use_count = 0;
    local_40[1]._M_weak_count = 0;
    local_40[2]._vptr__Sp_counted_base = (_func_int **)0x5;
    local_40[2]._M_use_count = 0;
    local_40[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_001767d8;
    local_40[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_40[3]._M_use_count = 0;
    local_40[3]._M_weak_count = 0;
    local_40[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_40[4]._M_use_count = 0;
    local_40[4]._M_weak_count = 0;
    local_40[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_40[5]._M_use_count = 0;
    local_40[5]._M_weak_count = 0;
    puVar5 = (undefined8 *)*in_RDX;
    puVar1 = (undefined8 *)in_RDX[1];
    if (puVar5 != puVar1) {
      p_Var3 = local_40 + 4;
      do {
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
        (local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count = 1;
        (local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_weak_count = 1;
        (local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00176820;
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 1);
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = 1;
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._vptr__Sp_counted_base = (_func_int **)*puVar5;
        uVar2 = puVar5[1];
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._M_use_count = (int)uVar2;
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
        puVar5[1] = 0;
        local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     *)&p_Var3->_M_use_count,&local_58);
        if (local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        puVar5 = puVar5 + 2;
      } while (puVar5 != puVar1);
    }
    pVar6 = send_msg_to_leader(this,(ptr<req_msg> *)local_38);
    _Var4 = pVar6.
            super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      _Var4._M_pi = extraout_RDX;
    }
  }
  pVar6.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  pVar6.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<async_result<bool>_>)
         pVar6.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::append_entries(std::vector<bufptr>& logs)
{
    if (logs.size() == 0)
    {
        bool result(false);
        return cs_new<async_result<bool>>(result);
    }

    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::client_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    for (auto& item : logs)
    {
        ptr<log_entry> log(cs_new<log_entry>(0, std::move(item), log_val_type::app_log));
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req);
}